

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O2

string * efsw::Platform::FileSystem::getCurrentWorkingDirectory_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  char dir [4097];
  allocator local_1019;
  char local_1018 [4112];
  
  pcVar1 = getcwd(local_1018,0x1001);
  if (pcVar1 == (char *)0x0) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_1019);
  }
  return in_RDI;
}

Assistant:

std::string FileSystem::getCurrentWorkingDirectory() {
	char dir[PATH_MAX + 1];
	char* result = getcwd( dir, PATH_MAX + 1 );
	return result != NULL ? std::string( result ) : std::string();
}